

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpserver.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  __pid_t _Var8;
  uint __fd;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  ssize_t sVar12;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  sigset_t *psVar18;
  __sigset_t *p_Var19;
  ulong uVar20;
  byte *pbVar21;
  byte bVar22;
  socklen_t sin_size;
  sockaddr_can caddr;
  sockaddr_in saddr;
  fd_set readfds;
  sockaddr_in clientaddr;
  sigaction signalaction;
  sigset_t sigset;
  uchar msg [6001];
  char rxmsg [12004];
  char txmsg [12003];
  uint local_77b4;
  ulong local_77b0;
  ulong local_77a8;
  ulong local_7798;
  socklen_t local_7784;
  ulong local_7780;
  sockaddr local_7778;
  ulong local_7760;
  char *local_7758;
  ulong local_7750;
  sockaddr local_7748;
  fd_set local_7738;
  sockaddr local_76b0;
  sigaction local_76a0;
  sigset_t local_7608;
  byte local_7588 [6016];
  timespec local_5e08 [751];
  char local_2f18 [12008];
  
  bVar22 = 0;
  local_7784 = 0x10;
  local_7778.sa_data[6] = -1;
  local_7778.sa_data[7] = -1;
  local_7778.sa_data[8] = -1;
  local_7778.sa_data[9] = -1;
  local_7778.sa_data[10] = -1;
  local_7778.sa_data[0xb] = -1;
  local_7778.sa_data[0xc] = -1;
  local_7778.sa_data[0xd] = -1;
  local_77b0 = 0xffffffff;
  local_77a8 = 0xffffffff;
  local_7798 = 0;
  bVar4 = false;
switchD_0010160c_caseD_76:
  while( true ) {
    bVar2 = bVar4;
    uVar5 = getopt(argc,argv,"l:s:d:x:p:P:b:m:w:t:L:v?");
    if (0x4f < (int)uVar5) goto code_r0x001015ff;
    if (uVar5 != 0x4c) break;
    iVar6 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x10412c,0x10412d);
    bVar4 = bVar2;
    if (iVar6 != 3) {
      pcVar9 = "unknown link layer options \'%s\'.\n";
      goto LAB_00101968;
    }
  }
  if (uVar5 != 0xffffffff) {
    if (uVar5 == 0x3f) goto LAB_0010196f;
    goto switchD_0010160c_caseD_63;
  }
  if ((((argc - _optind != 1) || ((int)local_7798 == 0)) || ((int)local_77a8 == -1)) ||
     ((int)local_77b0 == -1)) goto LAB_00101949;
  sigemptyset(&local_7608);
  local_76a0.__sigaction_handler.sa_handler = childdied;
  psVar18 = &local_7608;
  p_Var19 = &local_76a0.sa_mask;
  for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
    p_Var19->__val[0] = psVar18->__val[0];
    psVar18 = (sigset_t *)((long)psVar18 + ((ulong)bVar22 * -2 + 1) * 8);
    p_Var19 = (__sigset_t *)((long)p_Var19 + ((ulong)bVar22 * -2 + 1) * 8);
  }
  local_76a0.sa_flags = 0;
  sigaction(0x11,&local_76a0,(sigaction *)0x0);
  iVar6 = socket(2,1,0);
  if (iVar6 < 0) {
    pcVar9 = "inetsocket";
  }
  else {
    local_7748.sa_family = 2;
    local_7748.sa_data[2] = '\0';
    local_7748.sa_data[3] = '\0';
    local_7748.sa_data[4] = '\0';
    local_7748.sa_data[5] = '\0';
    local_7748.sa_data._0_2_ = (ushort)local_7798 << 8 | (ushort)local_7798 >> 8;
    iVar7 = bind(iVar6,&local_7748,0x10);
    if (iVar7 < 0) {
      do {
        local_5e08[0].tv_sec = 0;
        local_5e08[0].tv_nsec = 100000000;
        putchar(0x2e);
        fflush((FILE *)0x0);
        nanosleep(local_5e08,(timespec *)0x0);
        iVar7 = bind(iVar6,&local_7748,0x10);
      } while (iVar7 < 0);
    }
    iVar7 = listen(iVar6,3);
    if (iVar7 == 0) {
      do {
        while (uVar5 = accept(iVar6,&local_76b0,&local_7784), 0 < (int)uVar5) {
          _Var8 = fork();
          if (_Var8 == 0) {
            __fd = socket(0x1d,2,6);
            if ((int)__fd < 0) {
              pcVar9 = "socket";
              goto LAB_00101eb5;
            }
            setsockopt(__fd,0x6a,1,&main::opts,0xc);
            setsockopt(__fd,0x6a,2,&main::fcopts,3);
            if ((main::llopts.tx_dl != '\0') &&
               (iVar6 = setsockopt(__fd,0x6a,5,&main::llopts,3), iVar6 < 0)) {
              pcVar9 = "link layer sockopt";
              goto LAB_00101eb5;
            }
            local_7778.sa_family = 0x1d;
            local_7778.sa_data._2_4_ = if_nametoindex(argv[_optind]);
            if (local_7778.sa_data._2_4_ == 0) {
              pcVar9 = "if_nametoindex";
              goto LAB_00101eb5;
            }
            iVar6 = bind(__fd,&local_7778,0x18);
            if (iVar6 < 0) {
              pcVar9 = "bind";
              goto LAB_00101eb5;
            }
            uVar11 = 1L << ((byte)__fd & 0x3f);
            local_7750 = (ulong)(__fd >> 6);
            uVar16 = 1L << ((byte)uVar5 & 0x3f);
            uVar14 = uVar5;
            if (uVar5 < __fd) {
              uVar14 = __fd;
            }
            local_7758 = (char *)((ulong)local_5e08 | 1);
            local_7760 = (ulong)local_2f18 | 1;
            local_77b4 = 0;
            goto LAB_00101c0a;
          }
          close(uVar5);
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      pcVar9 = "accept";
    }
    else {
      pcVar9 = "listen";
    }
  }
  goto LAB_00101eb5;
LAB_00101c0a:
  do {
    uVar17 = local_7750;
    uVar3 = local_77b4;
    local_7738.fds_bits[0xe] = 0;
    local_7738.fds_bits[0xf] = 0;
    local_7738.fds_bits[0xc] = 0;
    local_7738.fds_bits[0xd] = 0;
    local_7738.fds_bits[10] = 0;
    local_7738.fds_bits[0xb] = 0;
    local_7738.fds_bits[8] = 0;
    local_7738.fds_bits[9] = 0;
    local_7738.fds_bits[6] = 0;
    local_7738.fds_bits[7] = 0;
    local_7738.fds_bits[4] = 0;
    local_7738.fds_bits[5] = 0;
    local_7738.fds_bits[2] = 0;
    local_7738.fds_bits[3] = 0;
    local_7738.fds_bits[0] = 0;
    local_7738.fds_bits[1] = 0;
    local_7738.fds_bits[local_7750] = local_7738.fds_bits[local_7750] | uVar11;
    local_7738.fds_bits[uVar5 >> 6] = local_7738.fds_bits[uVar5 >> 6] | uVar16;
    select(uVar14 + 1,&local_7738,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if ((local_7738.fds_bits[uVar17] & uVar11) != 0) {
      sVar12 = read(__fd,local_7588,0x1771);
      if ((uint)sVar12 - 0x1771 < 0xffffe890) {
        pcVar9 = "read from isotp socket";
        goto LAB_00101eb5;
      }
      local_5e08[0].tv_sec = CONCAT71(local_5e08[0].tv_sec._1_7_,0x3c);
      uVar17 = 0;
      pcVar9 = local_7758;
      do {
        sprintf(pcVar9,"%02X",(ulong)local_7588[uVar17]);
        uVar17 = uVar17 + 1;
        pcVar9 = pcVar9 + 2;
      } while (((uint)sVar12 & 0x7fffffff) != uVar17);
      sVar13 = strlen((char *)local_5e08);
      *(undefined2 *)((long)&local_5e08[0].tv_sec + sVar13) = 0xa3e;
      *(undefined1 *)((long)&local_5e08[0].tv_sec + sVar13 + 2) = 0;
      if (bVar2) {
        printf("CAN>TCP %s",local_5e08);
      }
      sVar13 = strlen((char *)local_5e08);
      send(uVar5,local_5e08,sVar13,0);
    }
  } while ((local_7738.fds_bits[uVar5 >> 6] & uVar16) == 0);
  lVar15 = (long)(int)local_77b4;
  sVar12 = read(uVar5,local_2f18 + lVar15,1);
  if (0 < sVar12) {
    if (local_77b4 == 0) {
      local_77b4 = (uint)(local_2f18[0] == '<');
    }
    else {
      local_77b4 = 0;
      if ((int)uVar3 < 0x2ee2) {
        local_77b4 = uVar3 + 1;
        if (local_2f18[lVar15] == '>') {
          local_2f18[lVar15 + 1] = '\0';
          sVar13 = strlen(local_2f18);
          local_77b4 = 0;
          if ((sVar13 & 1) == 0 && 3 < sVar13) {
            if (bVar2) {
              printf("TCP>CAN %s\n",local_2f18);
            }
            sVar13 = strlen(local_2f18);
            local_7780 = sVar13 + 0x1fffffffe >> 1;
            if (0 < (int)(uint)local_7780) {
              uVar20 = (ulong)((uint)local_7780 & 0x7fffffff);
              pbVar21 = local_7588;
              uVar17 = local_7760;
              do {
                local_77b4 = 0;
                iVar6 = __isoc99_sscanf(uVar17,"%2hhx",pbVar21);
                if (iVar6 == 0) goto LAB_00101c0a;
                pbVar21 = pbVar21 + 1;
                uVar17 = uVar17 + 2;
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
            }
            local_77b4 = 0;
            send(__fd,local_7588,(long)(int)local_7780,0);
          }
        }
      }
    }
    goto LAB_00101c0a;
  }
  pcVar9 = "read from tcp/ip socket";
LAB_00101eb5:
  perror(pcVar9);
  goto LAB_00101eba;
switchD_0010160c_caseD_63:
  fprintf(_stderr,"Unknown option %c\n",(ulong)uVar5);
LAB_00101949:
  pcVar9 = __xpg_basename(*argv);
  print_usage(pcVar9);
LAB_00101eba:
  exit(1);
code_r0x001015ff:
  bVar4 = true;
  switch(uVar5) {
  case 0x62:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.bs = (__u8)uVar11;
    bVar4 = bVar2;
    goto switchD_0010160c_caseD_76;
  case 99:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_0010160c_caseD_63;
  case 100:
    local_77b0 = strtoul(_optarg,(char **)0x0,0x10);
    local_7778.sa_data._6_4_ = (uint)local_77b0;
    sVar13 = strlen(_optarg);
    bVar4 = bVar2;
    if (7 < sVar13) {
      local_7778.sa_data._6_4_ = (uint)local_77b0 | 0x80000000;
      local_77b0 = (ulong)(uint)local_7778.sa_data._6_4_;
    }
    goto switchD_0010160c_caseD_76;
  case 0x6c:
    local_7798 = strtoul(_optarg,(char **)0x0,10);
    bVar4 = bVar2;
    goto switchD_0010160c_caseD_76;
  case 0x6d:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.stmin = (__u8)uVar11;
    bVar4 = bVar2;
    goto switchD_0010160c_caseD_76;
  case 0x70:
    iVar6 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x104125,0x104126);
    if (iVar6 == 2) {
      main::opts.flags = main::opts.flags | 0xc;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    if (iVar6 == 1) {
      main::opts.flags = main::opts.flags | 4;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    iVar6 = __isoc99_sscanf(_optarg,":%hhx",0x104126);
    if (iVar6 == 1) {
      main::opts.flags = main::opts.flags | 8;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    pcVar9 = "incorrect padding values \'%s\'.\n";
    break;
  case 0x73:
    local_77a8 = strtoul(_optarg,(char **)0x0,0x10);
    uVar5 = (uint)local_77a8;
    local_7778.sa_data._10_4_ = uVar5;
    sVar13 = strlen(_optarg);
    bVar4 = bVar2;
    if (7 < sVar13) {
      local_77a8 = (ulong)(uVar5 | 0x80000000);
      local_7778.sa_data._10_4_ = uVar5 | 0x80000000;
    }
    goto switchD_0010160c_caseD_76;
  case 0x74:
    uVar11 = strtoul(_optarg,(char **)0x0,10);
    main::opts.frame_txtime = (__u32)uVar11;
    bVar4 = bVar2;
  case 0x76:
    goto switchD_0010160c_caseD_76;
  case 0x77:
    uVar11 = strtoul(_optarg,(char **)0x0,0x10);
    main::fcopts.wftmax = (__u8)uVar11;
    bVar4 = bVar2;
    goto switchD_0010160c_caseD_76;
  case 0x78:
    iVar6 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x104124,0x104127);
    uVar5 = 2;
    if (iVar6 == 1) {
LAB_00101796:
      main::opts.flags = main::opts.flags | uVar5;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    if (iVar6 == 2) {
      uVar5 = 0x202;
      goto LAB_00101796;
    }
    pcVar9 = "incorrect extended addr values \'%s\'.\n";
    break;
  default:
    if (uVar5 != 0x50) goto switchD_0010160c_caseD_63;
    cVar1 = *_optarg;
    if (cVar1 == 'a') {
      main::opts.flags = main::opts.flags | 0x30;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    if (cVar1 == 'c') {
      main::opts.flags = main::opts.flags | 0x20;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    if (cVar1 == 'l') {
      main::opts.flags = main::opts.flags | 0x10;
      bVar4 = bVar2;
      goto switchD_0010160c_caseD_76;
    }
    printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)cVar1);
    goto LAB_0010196f;
  }
LAB_00101968:
  printf(pcVar9,_optarg);
LAB_0010196f:
  pcVar9 = __xpg_basename(*argv);
  print_usage(pcVar9);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	extern int optind, opterr, optopt;
	int opt;

	int sl, sa, sc; /* (L)isten, (A)ccept, (C)AN sockets */ 
	struct sockaddr_in  saddr, clientaddr;
	struct sockaddr_can caddr;
	static struct can_isotp_options opts;
	static struct can_isotp_fc_options fcopts;
	static struct can_isotp_ll_options llopts;
	socklen_t sin_size = sizeof(clientaddr);
	socklen_t caddrlen = sizeof(caddr);

	struct sigaction signalaction;
	sigset_t sigset;

	fd_set readfds;

	int i;
	int nbytes;

	int local_port = 0;
	int verbose = 0;

	int idx = 0; /* index in txmsg[] */

	unsigned char msg[MAX_PDU_LENGTH + 1];   /* isotp socket message buffer (4095 + test_for_too_long_byte)*/
	char rxmsg[MAX_PDU_LENGTH * 2 + 4]; /* isotp->tcp ASCII message buffer (4095*2 + < > \n null) */
	char txmsg[MAX_PDU_LENGTH * 2 + 3]; /* tcp->isotp ASCII message buffer (4095*2 + < > null) */

	/* mark missing mandatory commandline options as missing */
	caddr.can_addr.tp.tx_id = caddr.can_addr.tp.rx_id = NO_CAN_ID;

	while ((opt = getopt(argc, argv, "l:s:d:x:p:P:b:m:w:t:L:v?")) != -1) {
		switch (opt) {
		case 'l':
			local_port = strtoul(optarg, NULL, 10);
			break;

		case 's':
			caddr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
			break;

		case 'd':
			caddr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
			if (strlen(optarg) > 7)
				caddr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
			break;

		case 'x':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.ext_address,
					      &opts.rx_ext_address);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_EXTEND_ADDR;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
			else {
				printf("incorrect extended addr values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'p':
		{
			int elements = sscanf(optarg, "%hhx:%hhx",
					      &opts.txpad_content,
					      &opts.rxpad_content);

			if (elements == 1)
				opts.flags |= CAN_ISOTP_TX_PADDING;
			else if (elements == 2)
				opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
			else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
				opts.flags |= CAN_ISOTP_RX_PADDING;
			else {
				printf("incorrect padding values '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;
		}

		case 'P':
			if (optarg[0] == 'l')
				opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
			else if (optarg[0] == 'c')
				opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
			else if (optarg[0] == 'a')
				opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
			else {
				printf("unknown padding check option '%c'.\n", optarg[0]);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'b':
			fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'm':
			fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 'w':
			fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
			break;

		case 't':
			opts.frame_txtime = strtoul(optarg, NULL, 10);
			break;

		case 'L':
			if (sscanf(optarg, "%hhu:%hhu:%hhu",
				   &llopts.mtu,
				   &llopts.tx_dl,
				   &llopts.tx_flags) != 3) {
				printf("unknown link layer options '%s'.\n", optarg);
				print_usage(basename(argv[0]));
				exit(0);
			}
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 1) || (local_port == 0) ||
	    (caddr.can_addr.tp.tx_id == NO_CAN_ID) ||
	    (caddr.can_addr.tp.rx_id == NO_CAN_ID)) {
		print_usage(basename(argv[0]));
		exit(1);
	}
  
	sigemptyset(&sigset);
	signalaction.sa_handler = &childdied;
	signalaction.sa_mask = sigset;
	signalaction.sa_flags = 0;
	sigaction(SIGCHLD, &signalaction, NULL);  /* signal for dying child */

	if((sl = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
		perror("inetsocket");
		exit(1);
	}

	saddr.sin_family = AF_INET;
	saddr.sin_addr.s_addr = htonl(INADDR_ANY);
	saddr.sin_port = htons(local_port);

	while(bind(sl,(struct sockaddr*)&saddr, sizeof(saddr)) < 0) {
		struct timespec f = {
			.tv_nsec = 100 * 1000 * 1000,
		};

		printf(".");
		fflush(NULL);
		nanosleep(&f, NULL);
	}

	if (listen(sl, 3) != 0) {
		perror("listen");
		exit(1);
	}

	while (1) { 
		sa = accept(sl,(struct sockaddr *)&clientaddr, &sin_size);
		if (sa > 0 ){
			if (!fork())
				break;
			close(sa);
		}
		else {
			if (errno != EINTR) {
				/*
				 * If the cause for the error was NOT the
				 * signal from a dying child => give an error
				 */
				perror("accept");
				exit(1);
			}
		}
	}

	if ((sc = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
		perror("socket");
		exit(1);
	}

	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
	setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

	if (llopts.tx_dl) {
		if (setsockopt(sc, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
			perror("link layer sockopt");
			exit(1);
		}
	}

	caddr.can_family = AF_CAN;
	caddr.can_ifindex = if_nametoindex(argv[optind]);
	if (!caddr.can_ifindex) {
		perror("if_nametoindex");
		exit(1);
	}

	if (bind(sc, (struct sockaddr *)&caddr, caddrlen) < 0) {
		perror("bind");
		exit(1);
	}

	while (1) {

		FD_ZERO(&readfds);
		FD_SET(sc, &readfds);
		FD_SET(sa, &readfds);

		select((sc > sa)?sc+1:sa+1, &readfds, NULL, NULL, NULL);

		if (FD_ISSET(sc, &readfds)) {


			nbytes = read(sc, &msg, MAX_PDU_LENGTH + 1);

			if (nbytes < 1 || nbytes > MAX_PDU_LENGTH) {
				perror("read from isotp socket");
				exit(1);
			}

			rxmsg[0] = '<';

			for ( i = 0; i < nbytes; i++)
				sprintf(rxmsg + 1 + 2*i, "%02X", msg[i]);

			/* finalize string for sending */
			strcat(rxmsg, ">\n");

			if (verbose)
				printf("CAN>TCP %s", rxmsg);

			send(sa, rxmsg, strlen(rxmsg), 0);
		}


		if (FD_ISSET(sa, &readfds)) {

			if (read(sa, txmsg+idx, 1) < 1) {
				perror("read from tcp/ip socket");
				exit(1);
			}

			if (!idx) {
				if (txmsg[0] == '<')
					idx = 1;

				continue;
			}

			/* max len is 4095*2 + '<' + '>' = 8192. The buffer index starts with 0 */
			if (idx > MAX_PDU_LENGTH * 2 + 1) {
				idx = 0;
				continue;
			}

			if (txmsg[idx] != '>') {
				idx++;
				continue;
			}

			txmsg[idx+1] = 0;
			idx = 0;

			/* must be an even number of bytes and at least one data byte <XX> */
			if (strlen(txmsg) < 4 || strlen(txmsg) % 2)
				continue;

			if (verbose)
				printf("TCP>CAN %s\n", txmsg);

			nbytes = (strlen(txmsg)-2)/2;
			if (b64hex(txmsg+1, msg, nbytes) == 0)
				send(sc, msg, nbytes, 0);
		}
	}

	close(sc);
	close(sa);

	return 0;
}